

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

int worker_aux(worker_t *w)

{
  int *piVar1;
  int iVar2;
  bool bVar3;
  int local_24;
  int local_20;
  int clen;
  int stop;
  int i;
  worker_t *w_local;
  
  local_20 = 0;
  _stop = w;
  pthread_mutex_lock((pthread_mutex_t *)&w->mt->lock);
  while( true ) {
    bVar3 = false;
    if (_stop->toproc == 0) {
      bVar3 = _stop->mt->done == 0;
    }
    if (!bVar3) break;
    pthread_cond_wait((pthread_cond_t *)&_stop->mt->cv,(pthread_mutex_t *)&_stop->mt->lock);
  }
  if (_stop->mt->done != 0) {
    local_20 = 1;
  }
  _stop->toproc = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&_stop->mt->lock);
  if (local_20 == 0) {
    _stop->errcode = 0;
    for (clen = _stop->i; clen < _stop->mt->curr; clen = _stop->mt->n_threads + clen) {
      local_24 = 0x10000;
      iVar2 = bgzf_compress(_stop->buf,&local_24,_stop->mt->blk[clen],_stop->mt->len[clen],
                            _stop->compress_level);
      if (iVar2 != 0) {
        _stop->errcode = _stop->errcode | 1;
      }
      memcpy(_stop->mt->blk[clen],_stop->buf,(long)local_24);
      _stop->mt->len[clen] = local_24;
    }
    LOCK();
    piVar1 = &_stop->mt->proc_cnt;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    w_local._4_4_ = 0;
  }
  else {
    w_local._4_4_ = 1;
  }
  return w_local._4_4_;
}

Assistant:

static int worker_aux(worker_t *w)
{
    int i, stop = 0;
    // wait for condition: to process or all done
    pthread_mutex_lock(&w->mt->lock);
    while (!w->toproc && !w->mt->done)
        pthread_cond_wait(&w->mt->cv, &w->mt->lock);
    if (w->mt->done) stop = 1;
    w->toproc = 0;
    pthread_mutex_unlock(&w->mt->lock);
    if (stop) return 1; // to quit the thread
    w->errcode = 0;
    for (i = w->i; i < w->mt->curr; i += w->mt->n_threads) {
        int clen = BGZF_MAX_BLOCK_SIZE;
        if (bgzf_compress(w->buf, &clen, w->mt->blk[i], w->mt->len[i], w->compress_level) != 0)
            w->errcode |= BGZF_ERR_ZLIB;
        memcpy(w->mt->blk[i], w->buf, clen);
        w->mt->len[i] = clen;
    }
    __sync_fetch_and_add(&w->mt->proc_cnt, 1);
    return 0;
}